

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O0

void __thiscall llvm::FoldingSetNodeID::AddString(FoldingSetNodeID *this,StringRef String)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint local_50;
  uint local_4c;
  uint V;
  uint V_1;
  uint *Base;
  uint local_38;
  uint Pos;
  uint Units;
  uint Size;
  FoldingSetNodeID *this_local;
  StringRef String_local;
  
  String_local.Data = (char *)String.Length;
  this_local = (FoldingSetNodeID *)String.Data;
  String_local.Length = (size_t)&this_local;
  Pos = (uint)String.Length;
  _Units = this;
  SmallVectorTemplateBase<unsigned_int,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&Pos);
  if (Pos == 0) {
    return;
  }
  local_38 = Pos >> 2;
  Base._4_4_ = 0;
  _V = this_local;
  if (((ulong)this_local & 3) == 0) {
    SmallVectorImpl<unsigned_int>::append<unsigned_int_const*,void>
              ((SmallVectorImpl<unsigned_int> *)this,(uint *)this_local,
               (uint *)((this_local->Bits).super_SmallVectorStorage<unsigned_int,_32U>.InlineElts +
                       ((ulong)local_38 - 4)));
    Base._4_4_ = (local_38 + 1) * 4;
  }
  else {
    for (Base._4_4_ = 4; Base._4_4_ <= Pos; Base._4_4_ = Base._4_4_ + 4) {
      bVar4 = StringRef::operator[]((StringRef *)&this_local,(ulong)(Base._4_4_ - 1));
      bVar1 = StringRef::operator[]((StringRef *)&this_local,(ulong)(Base._4_4_ - 2));
      bVar2 = StringRef::operator[]((StringRef *)&this_local,(ulong)(Base._4_4_ - 3));
      bVar3 = StringRef::operator[]((StringRef *)&this_local,(ulong)(Base._4_4_ - 4));
      local_4c = (uint)bVar4 << 0x18 | (uint)bVar1 << 0x10 | (uint)bVar2 << 8 | (uint)bVar3;
      SmallVectorTemplateBase<unsigned_int,_true>::push_back
                ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&local_4c);
    }
  }
  local_50 = 0;
  iVar5 = Base._4_4_ - Pos;
  if (iVar5 == 1) {
    bVar4 = StringRef::operator[]((StringRef *)&this_local,(ulong)(Pos - 3));
    local_50 = (uint)bVar4;
  }
  else if (iVar5 != 2) {
    if (iVar5 != 3) {
      return;
    }
    goto LAB_00208633;
  }
  uVar6 = local_50 << 8;
  bVar4 = StringRef::operator[]((StringRef *)&this_local,(ulong)(Pos - 2));
  local_50 = uVar6 | bVar4;
LAB_00208633:
  uVar6 = local_50 << 8;
  bVar4 = StringRef::operator[]((StringRef *)&this_local,(ulong)(Pos - 1));
  local_50 = uVar6 | bVar4;
  SmallVectorTemplateBase<unsigned_int,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&local_50);
  return;
}

Assistant:

void FoldingSetNodeID::AddString(StringRef String) {
  unsigned Size =  String.size();
  Bits.push_back(Size);
  if (!Size) return;

  unsigned Units = Size / 4;
  unsigned Pos = 0;
  const unsigned *Base = (const unsigned*) String.data();

  // If the string is aligned do a bulk transfer.
  if (!((intptr_t)Base & 3)) {
    Bits.append(Base, Base + Units);
    Pos = (Units + 1) * 4;
  } else {
    // Otherwise do it the hard way.
    // To be compatible with above bulk transfer, we need to take endianness
    // into account.
    static_assert(sys::IsBigEndianHost || sys::IsLittleEndianHost,
                  "Unexpected host endianness");
    if (sys::IsBigEndianHost) {
      for (Pos += 4; Pos <= Size; Pos += 4) {
        unsigned V = ((unsigned char)String[Pos - 4] << 24) |
                     ((unsigned char)String[Pos - 3] << 16) |
                     ((unsigned char)String[Pos - 2] << 8) |
                      (unsigned char)String[Pos - 1];
        Bits.push_back(V);
      }
    } else {  // Little-endian host
      for (Pos += 4; Pos <= Size; Pos += 4) {
        unsigned V = ((unsigned char)String[Pos - 1] << 24) |
                     ((unsigned char)String[Pos - 2] << 16) |
                     ((unsigned char)String[Pos - 3] << 8) |
                      (unsigned char)String[Pos - 4];
        Bits.push_back(V);
      }
    }
  }

  // With the leftover bits.
  unsigned V = 0;
  // Pos will have overshot size by 4 - #bytes left over.
  // No need to take endianness into account here - this is always executed.
  switch (Pos - Size) {
  case 1: V = (V << 8) | (unsigned char)String[Size - 3]; LLVM_FALLTHROUGH;
  case 2: V = (V << 8) | (unsigned char)String[Size - 2]; LLVM_FALLTHROUGH;
  case 3: V = (V << 8) | (unsigned char)String[Size - 1]; break;
  default: return; // Nothing left.
  }

  Bits.push_back(V);
}